

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_storage_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  stopper func;
  callback<void_(const_std::error_code_&)> *this;
  ostream *this_00;
  char **in_RSI;
  int in_EDI;
  ptime pVar1;
  exception *e;
  deadline_timer timer;
  service srv;
  stopper local_80 [2];
  callback<void_(const_std::error_code_&)> *local_70;
  int local_68;
  callback<void_(const_std::error_code_&)> *local_60;
  int local_58;
  deadline_timer local_50 [56];
  service local_18 [20];
  undefined4 local_4;
  
  local_4 = 0;
  cppcms::service::service(local_18,in_EDI,in_RSI);
  func.srv = (service *)cppcms::service::get_io_service();
  booster::aio::deadline_timer::deadline_timer(local_50,(io_service *)func.srv);
  pVar1 = booster::ptime::seconds(0x10234e);
  this = (callback<void_(const_std::error_code_&)> *)pVar1.sec;
  local_68 = pVar1.nsec;
  pVar1._8_8_ = this;
  pVar1.sec = (longlong)local_50;
  local_70 = this;
  local_60 = this;
  local_58 = local_68;
  booster::aio::deadline_timer::expires_from_now(pVar1);
  stopper::stopper(local_80,local_18);
  booster::callback<void_(const_std::error_code_&)>::callback<stopper>(this,func);
  booster::aio::deadline_timer::async_wait((callback *)local_50);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x1023d2);
  cppcms::service::run();
  booster::aio::deadline_timer::~deadline_timer(local_50);
  cppcms::service::~service(local_18);
  this_00 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc,char **argv)
{

	try {
		cppcms::service srv(argc,argv);

		booster::aio::deadline_timer timer(srv.get_io_service());
		timer.expires_from_now(booster::ptime::seconds(1));
		timer.async_wait(stopper(&srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr<< "Failed: " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}